

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O0

bool __thiscall
flatbuffers::VerifierTemplate<false>::VerifyTableStart(VerifierTemplate<false> *this,uint8_t *table)

{
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  size_t sVar4;
  bool local_49;
  unsigned_short vsize;
  size_t vtableo;
  size_t tableo;
  uint8_t *table_local;
  VerifierTemplate<false> *this_local;
  
  sVar4 = (long)table - (long)this->buf_;
  bVar1 = Verify<int>(this,sVar4);
  if (bVar1) {
    iVar3 = ReadScalar<int>(table);
    sVar4 = sVar4 - (long)iVar3;
    bVar1 = VerifyComplexity(this);
    if ((bVar1) && (bVar1 = Verify<unsigned_short>(this,sVar4), bVar1)) {
      uVar2 = ReadScalar<unsigned_short>(this->buf_ + sVar4);
      bVar1 = VerifyAlignment(this,(ulong)uVar2,2);
      if (bVar1) {
        uVar2 = ReadScalar<unsigned_short>(this->buf_ + sVar4);
        bVar1 = Check(this,(uVar2 & 1) == 0);
        local_49 = false;
        if (bVar1) {
          local_49 = Verify(this,sVar4,(ulong)uVar2);
        }
        return local_49;
      }
    }
  }
  return false;
}

Assistant:

bool VerifyTableStart(const uint8_t *const table) {
    // Check the vtable offset.
    const auto tableo = static_cast<size_t>(table - buf_);
    if (!Verify<soffset_t>(tableo)) return false;
    // This offset may be signed, but doing the subtraction unsigned always
    // gives the result we want.
    const auto vtableo =
        tableo - static_cast<size_t>(ReadScalar<soffset_t>(table));
    // Check the vtable size field, then check vtable fits in its entirety.
    if (!(VerifyComplexity() && Verify<voffset_t>(vtableo) &&
          VerifyAlignment(ReadScalar<voffset_t>(buf_ + vtableo),
                          sizeof(voffset_t))))
      return false;
    const auto vsize = ReadScalar<voffset_t>(buf_ + vtableo);
    return Check((vsize & 1) == 0) && Verify(vtableo, vsize);
  }